

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O2

bool tcmalloc::anon_unknown_0::ExtractUntilChar(char *text,int c,char **endptr)

{
  char *pcVar1;
  undefined8 uStackY_20;
  
  if (text == (char *)0x0) {
    pcVar1 = "text";
    uStackY_20 = 0x78;
  }
  else {
    if (endptr != (char **)0x0) {
      pcVar1 = strchr(text,c);
      if (pcVar1 == (char *)0x0) {
        *endptr = (char *)0x0;
      }
      else {
        *endptr = pcVar1;
        *pcVar1 = '\0';
      }
      return pcVar1 != (char *)0x0;
    }
    pcVar1 = "endptr";
    uStackY_20 = 0x79;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/base/proc_maps_iterator.cc"
          ,uStackY_20,pcVar1,"!=","nullptr");
  abort();
}

Assistant:

bool ExtractUntilChar(char *text, int c, char **endptr) {
  CHECK_NE(text, nullptr);
  CHECK_NE(endptr, nullptr);
  char *found;
  found = strchr(text, c);
  if (found == nullptr) {
    *endptr = nullptr;
    return false;
  }

  *endptr = found;
  *found = '\0';
  return true;
}